

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,string_view begin_varname,string_view end_varname,string_view file_name,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Annotate(this,begin_varname,end_varname,file_name,(vector<int,_std::allocator<int>_> *)&local_28
             ,semantic);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  }
  return;
}

Assistant:

void Annotate(
      absl::string_view begin_varname, absl::string_view end_varname,
      absl::string_view file_name,
      absl::optional<AnnotationCollector::Semantic> semantic = absl::nullopt) {
    if (options_.annotation_collector == nullptr) {
      return;
    }

    Annotate(begin_varname, end_varname, file_name, {}, semantic);
  }